

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcmarker.c
# Opt level: O0

void emit_dac(j_compress_ptr cinfo)

{
  long in_RDI;
  jpeg_component_info *compptr;
  int i;
  int length;
  char ac_in_use [16];
  char dc_in_use [16];
  long in_stack_ffffffffffffffc8;
  JPEG_MARKER mark;
  int iVar1;
  int iVar2;
  char acStack_28 [16];
  char acStack_18 [16];
  long local_8;
  
  for (iVar1 = 0; iVar1 < 0x10; iVar1 = iVar1 + 1) {
    acStack_28[iVar1] = '\0';
    acStack_18[iVar1] = '\0';
  }
  local_8 = in_RDI;
  for (iVar1 = 0; iVar1 < *(int *)(local_8 + 0x170); iVar1 = iVar1 + 1) {
    in_stack_ffffffffffffffc8 = *(long *)(local_8 + 0x178 + (long)iVar1 * 8);
    if ((*(int *)(local_8 + 0x1cc) == 0) && (*(int *)(local_8 + 0x1d4) == 0)) {
      acStack_18[*(int *)(in_stack_ffffffffffffffc8 + 0x14)] = '\x01';
    }
    if (*(int *)(local_8 + 0x1d0) != 0) {
      acStack_28[*(int *)(in_stack_ffffffffffffffc8 + 0x18)] = '\x01';
    }
  }
  iVar1 = 0;
  for (iVar2 = 0; iVar2 < 0x10; iVar2 = iVar2 + 1) {
    iVar1 = (int)acStack_18[iVar2] + (int)acStack_28[iVar2] + iVar1;
  }
  if (iVar1 != 0) {
    mark = (JPEG_MARKER)((ulong)in_stack_ffffffffffffffc8 >> 0x20);
    emit_marker((j_compress_ptr)CONCAT44(iVar1,iVar2),mark);
    emit_2bytes((j_compress_ptr)CONCAT44(iVar1,iVar2),mark);
    for (iVar2 = 0; iVar2 < 0x10; iVar2 = iVar2 + 1) {
      if (acStack_18[iVar2] != '\0') {
        emit_byte((j_compress_ptr)CONCAT44(iVar1,iVar2),mark);
        emit_byte((j_compress_ptr)CONCAT44(iVar1,iVar2),mark);
      }
      if (acStack_28[iVar2] != '\0') {
        emit_byte((j_compress_ptr)CONCAT44(iVar1,iVar2),mark);
        emit_byte((j_compress_ptr)CONCAT44(iVar1,iVar2),mark);
      }
    }
  }
  return;
}

Assistant:

LOCAL(void)
emit_dac (j_compress_ptr cinfo)
/* Emit a DAC marker */
/* Since the useful info is so small, we want to emit all the tables in */
/* one DAC marker.  Therefore this routine does its own scan of the table. */
{
#ifdef C_ARITH_CODING_SUPPORTED
  char dc_in_use[NUM_ARITH_TBLS];
  char ac_in_use[NUM_ARITH_TBLS];
  int length, i;
  jpeg_component_info *compptr;

  for (i = 0; i < NUM_ARITH_TBLS; i++)
    dc_in_use[i] = ac_in_use[i] = 0;

  for (i = 0; i < cinfo->comps_in_scan; i++) {
    compptr = cinfo->cur_comp_info[i];
    /* DC needs no table for refinement scan */
    if (cinfo->Ss == 0 && cinfo->Ah == 0)
      dc_in_use[compptr->dc_tbl_no] = 1;
    /* AC needs no table when not present */
    if (cinfo->Se)
      ac_in_use[compptr->ac_tbl_no] = 1;
  }

  length = 0;
  for (i = 0; i < NUM_ARITH_TBLS; i++)
    length += dc_in_use[i] + ac_in_use[i];

  if (length) {
    emit_marker(cinfo, M_DAC);

    emit_2bytes(cinfo, length*2 + 2);

    for (i = 0; i < NUM_ARITH_TBLS; i++) {
      if (dc_in_use[i]) {
	emit_byte(cinfo, i);
	emit_byte(cinfo, cinfo->arith_dc_L[i] + (cinfo->arith_dc_U[i]<<4));
      }
      if (ac_in_use[i]) {
	emit_byte(cinfo, i + 0x10);
	emit_byte(cinfo, cinfo->arith_ac_K[i]);
      }
    }
  }
#endif /* C_ARITH_CODING_SUPPORTED */
}